

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

int run_container_get_index(run_container_t *container,uint16_t x)

{
  _Bool _Var1;
  uint uVar2;
  uint uVar3;
  ushort in_SI;
  int *in_RDI;
  uint32_t endpoint;
  uint32_t length;
  uint32_t startpoint;
  int i;
  uint32_t x32;
  int sum;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_20;
  int local_18;
  int local_4;
  
  _Var1 = run_container_contains
                    ((run_container_t *)
                     CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                     (uint16_t)((uint)in_stack_ffffffffffffffd4 >> 0x10));
  if (_Var1) {
    local_18 = 0;
    for (local_20 = 0; local_20 < *in_RDI; local_20 = local_20 + 1) {
      uVar2 = (uint)*(ushort *)(*(long *)(in_RDI + 2) + (long)local_20 * 4);
      uVar3 = (uint)*(ushort *)(*(long *)(in_RDI + 2) + 2 + (long)local_20 * 4);
      if ((uint)in_SI <= uVar3 + uVar2) {
        if (uVar2 <= in_SI) {
          return local_18 + (in_SI - uVar2);
        }
        break;
      }
      local_18 = uVar3 + 1 + local_18;
    }
    local_4 = local_18 + -1;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int run_container_get_index(const run_container_t *container, uint16_t x) {
    if (run_container_contains(container, x)) {
        int sum = 0;
        uint32_t x32 = x;
        for (int i = 0; i < container->n_runs; i++) {
            uint32_t startpoint = container->runs[i].value;
            uint32_t length = container->runs[i].length;
            uint32_t endpoint = length + startpoint;
            if (x <= endpoint) {
                if (x < startpoint) break;
                return sum + (x32 - startpoint);
            } else {
                sum += length + 1;
            }
        }
        return sum - 1;
    } else {
        return -1;
    }
}